

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O3

void __thiscall tst_RoleMaskProxyModel::testItemDataTransParent(tst_RoleMaskProxyModel *this)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QStandardItemModel *this_00;
  QAbstractItemModelTester *this_01;
  size_t sVar6;
  QMap<int,_QVariant> itemData;
  RoleMaskProxyModel proxyModel;
  QModelIndex proxyIdx;
  QModelIndex baseIdx;
  QMap<int,_QVariant> local_b8;
  anon_union_24_3_e3d07ef4_for_data local_b0;
  int local_8c;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  QModelIndex local_68;
  QVariant local_50;
  
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,&this->super_QObject);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this_00 + 0xf8))(this_00,0,1,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this_00 + 0x100))(this_00,0,1,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  puVar1 = &local_50.d.field_0x18;
  (**(code **)(*(long *)this_00 + 0x60))(puVar1,this_00,0,0,&local_b0);
  QVariant::QVariant((QVariant *)&local_b0,1);
  bVar3 = (bool)(**(code **)(*(long *)this_00 + 0x98))(this_00,puVar1,&local_b0,0x100);
  cVar4 = QTest::qVerify(bVar3,"baseModel->setData(baseIdx, 1, Qt::UserRole)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x4f);
  QVariant::~QVariant((QVariant *)&local_b0);
  if (cVar4 != '\0') {
    QVariant::QVariant((QVariant *)&local_b0,2);
    bVar3 = (bool)(**(code **)(*(long *)this_00 + 0x98))
                            (this_00,&local_50.d.field_0x18,&local_b0,0x101);
    cVar4 = QTest::qVerify(bVar3,"baseModel->setData(baseIdx, 2, Qt::UserRole + 1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x50);
    QVariant::~QVariant((QVariant *)&local_b0);
    if (cVar4 != '\0') {
      (**(code **)(*(long *)this_00 + 0xb0))(&local_b8,this_00,&local_50.d.field_0x18);
      if (local_b8.d.d ==
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        sVar6 = 0;
      }
      else {
        sVar6 = *(size_t *)((long)local_b8.d.d + 0x30);
      }
      cVar4 = QTest::qCompare(sVar6,2,"itemData.size()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                              ,0x52);
      if (cVar4 != '\0') {
        local_68.r = 0x100;
        local_88.shared = (PrivateShared *)0x0;
        local_88._8_8_ = 0;
        local_88._16_8_ = 0;
        local_70 = 2;
        QMap<int,_QVariant>::value
                  ((QVariant *)&local_b0,&local_b8,&local_68.r,(QVariant *)&local_88);
        iVar5 = QVariant::toInt((bool *)local_b0.data);
        cVar4 = QTest::qCompare(iVar5,1,"itemData.value(Qt::UserRole).toInt()","1",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x53);
        QVariant::~QVariant((QVariant *)&local_b0);
        QVariant::~QVariant((QVariant *)&local_88);
        if (cVar4 != '\0') {
          local_68.r = 0x101;
          local_88.shared = (PrivateShared *)0x0;
          local_88._8_8_ = 0;
          local_88._16_8_ = 0;
          local_70 = 2;
          QMap<int,_QVariant>::value
                    ((QVariant *)&local_b0,&local_b8,&local_68.r,(QVariant *)&local_88);
          iVar5 = QVariant::toInt((bool *)local_b0.data);
          cVar4 = QTest::qCompare(iVar5,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x54);
          QVariant::~QVariant((QVariant *)&local_b0);
          QVariant::~QVariant((QVariant *)&local_88);
          if (cVar4 != '\0') {
            RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)&local_68,(QObject *)0x0);
            this_01 = (QAbstractItemModelTester *)operator_new(0x10);
            QAbstractItemModelTester::QAbstractItemModelTester
                      (this_01,(QAbstractItemModel *)&local_68,QtTest,(QObject *)this_00);
            *(undefined ***)this_01 = &PTR_metaObject_001339b0;
            RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&local_68);
            RoleMaskProxyModel::addMaskedRole((int)&local_68);
            RoleMaskProxyModel::addMaskedRole((int)&local_68);
            local_b0._forAlignment = -NAN;
            local_b0._8_8_ = 0;
            local_b0._16_8_ = 0;
            QIdentityProxyModel::index((int)&local_50,(int)&local_68,(QModelIndex *)0x0);
            QVariant::QVariant((QVariant *)&local_b0,200);
            bVar3 = (bool)RoleMaskProxyModel::setData(&local_68,&local_50,(int)&local_b0);
            cVar4 = QTest::qVerify(bVar3,"proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                   ,0x5b);
            QVariant::~QVariant((QVariant *)&local_b0);
            if (cVar4 != '\0') {
              RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&local_68,0));
              RoleMaskProxyModel::itemData((QModelIndex *)&local_88);
              uVar2 = local_88.shared;
              local_b0.shared = (PrivateShared *)local_b8.d.d;
              local_88.shared = (PrivateShared *)0x0;
              local_b8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                              )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                )uVar2;
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::~QExplicitlySharedDataPointerV2
                        ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                          *)&local_b0.shared);
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::~QExplicitlySharedDataPointerV2
                        ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                          *)&local_88.shared);
              if (local_b8.d.d ==
                  (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
                sVar6 = 0;
              }
              else {
                sVar6 = *(size_t *)((long)local_b8.d.d + 0x30);
              }
              cVar4 = QTest::qCompare(sVar6,3,"itemData.size()","3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x5e);
              if (cVar4 != '\0') {
                local_8c = 0x100;
                local_88.shared = (PrivateShared *)0x0;
                local_88._8_8_ = 0;
                local_88._16_8_ = 0;
                local_70 = 2;
                QMap<int,_QVariant>::value
                          ((QVariant *)&local_b0,&local_b8,&local_8c,(QVariant *)&local_88);
                iVar5 = QVariant::toInt((bool *)local_b0.data);
                cVar4 = QTest::qCompare(iVar5,1,"itemData.value(Qt::UserRole).toInt()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x5f);
                QVariant::~QVariant((QVariant *)&local_b0);
                QVariant::~QVariant((QVariant *)&local_88);
                if (cVar4 != '\0') {
                  local_8c = 0x102;
                  local_88.shared = (PrivateShared *)0x0;
                  local_88._8_8_ = 0;
                  local_88._16_8_ = 0;
                  local_70 = 2;
                  QMap<int,_QVariant>::value
                            ((QVariant *)&local_b0,&local_b8,&local_8c,(QVariant *)&local_88);
                  iVar5 = QVariant::toInt((bool *)local_b0.data);
                  cVar4 = QTest::qCompare(iVar5,200,"itemData.value(Qt::UserRole + 2).toInt()","200"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0x60);
                  QVariant::~QVariant((QVariant *)&local_b0);
                  QVariant::~QVariant((QVariant *)&local_88);
                  if (cVar4 != '\0') {
                    local_8c = 0x101;
                    local_88.shared = (PrivateShared *)0x0;
                    local_88._8_8_ = 0;
                    local_88._16_8_ = 0;
                    local_70 = 2;
                    QMap<int,_QVariant>::value
                              ((QVariant *)&local_b0,&local_b8,&local_8c,(QVariant *)&local_88);
                    iVar5 = QVariant::toInt((bool *)local_b0.data);
                    cVar4 = QTest::qCompare(iVar5,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                            ,0x61);
                    QVariant::~QVariant((QVariant *)&local_b0);
                    QVariant::~QVariant((QVariant *)&local_88);
                    if (cVar4 != '\0') {
                      RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&local_68,0));
                      RoleMaskProxyModel::itemData((QModelIndex *)&local_88);
                      uVar2 = local_88.shared;
                      local_b0.shared = (PrivateShared *)local_b8.d.d;
                      local_88.shared = (PrivateShared *)0x0;
                      local_b8.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                      )(QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                        )uVar2;
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                  *)&local_b0.shared);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                  *)&local_88.shared);
                      if (local_b8.d.d ==
                          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                           *)0x0) {
                        sVar6 = 0;
                      }
                      else {
                        sVar6 = *(size_t *)((long)local_b8.d.d + 0x30);
                      }
                      cVar4 = QTest::qCompare(sVar6,2,"itemData.size()","2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,100);
                      if (cVar4 != '\0') {
                        local_8c = 0x100;
                        local_88.shared = (PrivateShared *)0x0;
                        local_88._8_8_ = 0;
                        local_88._16_8_ = 0;
                        local_70 = 2;
                        QMap<int,_QVariant>::value
                                  ((QVariant *)&local_b0,&local_b8,&local_8c,(QVariant *)&local_88);
                        iVar5 = QVariant::toInt((bool *)local_b0.data);
                        cVar4 = QTest::qCompare(iVar5,1,"itemData.value(Qt::UserRole).toInt()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x65);
                        QVariant::~QVariant((QVariant *)&local_b0);
                        QVariant::~QVariant((QVariant *)&local_88);
                        if (cVar4 != '\0') {
                          local_8c = 0x102;
                          local_88.shared = (PrivateShared *)0x0;
                          local_88._8_8_ = 0;
                          local_88._16_8_ = 0;
                          local_70 = 2;
                          QMap<int,_QVariant>::value
                                    ((QVariant *)&local_b0,&local_b8,&local_8c,(QVariant *)&local_88
                                    );
                          iVar5 = QVariant::toInt((bool *)local_b0.data);
                          cVar4 = QTest::qCompare(iVar5,200,
                                                  "itemData.value(Qt::UserRole + 2).toInt()","200",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x66);
                          QVariant::~QVariant((QVariant *)&local_b0);
                          QVariant::~QVariant((QVariant *)&local_88);
                          if (cVar4 != '\0') {
                            QObject::deleteLater();
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)&local_68);
          }
        }
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&local_b8.d);
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testItemDataTransParent()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = new ComplexModel(this);
    baseModel->insertRow(0);
    baseModel->insertColumn(0);
    const QModelIndex baseIdx = baseModel->index(0, 0);
    QVERIFY(baseModel->setData(baseIdx, 1, Qt::UserRole));
    QVERIFY(baseModel->setData(baseIdx, 2, Qt::UserRole + 1));
    auto itemData = baseModel->itemData(baseIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.addMaskedRole(Qt::UserRole + 1);
    proxyModel.addMaskedRole(Qt::UserRole + 2);
    const QModelIndex proxyIdx = proxyModel.index(0, 0);
    QVERIFY(proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2));
    proxyModel.setTransparentIfEmpty(true);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 3);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    proxyModel.setTransparentIfEmpty(false);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}